

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

ulong BN_get_word(BIGNUM *a)

{
  BIGNUM *a_local;
  ulong local_8;
  
  if (a->top < 2) {
    if (a->top == 1) {
      local_8 = *a->d;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

BN_ULONG BN_get_word(const BIGNUM *a)
{
    if (a->top > 1)
        return BN_MASK2;
    else if (a->top == 1)
        return a->d[0];
    /* a->top == 0 */
    return 0;
}